

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLHelper.hpp
# Opt level: O2

string * trim(string *__return_storage_ptr__,string *input)

{
  __const_iterator __first;
  borrowed_iterator_t<std::__cxx11::basic_string<char>_&> __last;
  __const_iterator local_28;
  pointer local_20;
  pointer local_18;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,input);
  __first._M_current = (__return_storage_ptr__->_M_dataplus)._M_p;
  __last = std::ranges::__find_if_fn::
           operator()<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::identity,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_KhronosGroup[P]Vulkan_Hpp_XMLHelper_hpp:529:63)>
                     ((__find_if_fn *)&std::ranges::find_if,__return_storage_ptr__);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
            (__return_storage_ptr__,__first,(__const_iterator)__last._M_current);
  local_20 = (__return_storage_ptr__->_M_dataplus)._M_p;
  local_18 = local_20 + __return_storage_ptr__->_M_string_length;
  std::
  find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,trim(std::__cxx11::string_const&)::_lambda(char)_2_>
            (&local_28);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
            (__return_storage_ptr__,local_28,
             (__const_iterator)
             ((__return_storage_ptr__->_M_dataplus)._M_p + __return_storage_ptr__->_M_string_length)
            );
  return __return_storage_ptr__;
}

Assistant:

inline std::string trim( std::string const & input )
{
  std::string result = input;
  result.erase( result.begin(), std::ranges::find_if( result, []( char c ) noexcept { return !std::isspace( c ); } ) );
  result.erase( std::find_if( result.rbegin(), result.rend(), []( char c ) noexcept { return !std::isspace( c ); } ).base(), result.end() );
  return result;
}